

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iffl_list.h
# Opt level: O1

sizes_t * __thiscall
iffl::
flat_forward_list<pod_array_list_entry<char>,_flat_forward_list_traits_unaligned<char>,_std::pmr::polymorphic_allocator<char>_>
::get_all_sizes(sizes_t *__return_storage_ptr__,
               flat_forward_list<pod_array_list_entry<char>,_flat_forward_list_traits_unaligned<char>,_std::pmr::polymorphic_allocator<char>_>
               *this)

{
  pointer_type pcVar1;
  ushort *puVar2;
  size_t sVar3;
  ulong uVar4;
  header_type_const_ptr unaligned_e;
  size_t sVar5;
  
  (__return_storage_ptr__->last_element).super_range.data_end = 0;
  (__return_storage_ptr__->last_element).super_range.buffer_end = 0;
  __return_storage_ptr__->total_capacity = 0;
  (__return_storage_ptr__->last_element).super_range.buffer_begin = 0;
  pcVar1 = (this->buffer_).v2_.begin;
  uVar4 = (long)(this->buffer_).v2_.end - (long)pcVar1;
  __return_storage_ptr__->total_capacity = uVar4;
  puVar2 = (ushort *)(this->buffer_).v2_.last;
  if (puVar2 != (ushort *)0x0) {
    sVar5 = (long)puVar2 - (long)pcVar1;
    sVar3 = sVar5 + *puVar2 + 2;
    last((flat_forward_list<pod_array_list_entry<char>,_flat_forward_list_traits_unaligned<char>,_std::pmr::polymorphic_allocator<char>_>
          *)&stack0xffffffffffffffd8);
    (__return_storage_ptr__->last_element).super_range.buffer_begin = sVar5;
    (__return_storage_ptr__->last_element).super_range.data_end = sVar3;
    (__return_storage_ptr__->last_element).super_range.buffer_end = sVar3;
  }
  if ((__return_storage_ptr__->last_element).super_range.data_end <= uVar4) {
    return __return_storage_ptr__;
  }
  std::terminate();
}

Assistant:

sizes_t get_all_sizes() const noexcept {
        sizes_t s;

        s.total_capacity = buff().end - buff().begin;

        if (nullptr != buff().last) {
            s.last_element = range_unsafe(const_iterator{ buff().last });
        }
        FFL_CODDING_ERROR_IF(s.total_capacity < s.used_capacity().size);

        return s;
    }